

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

void __thiscall wasm::I64ToI32Lowering::lowerTruncFloatToInt(I64ToI32Lowering *this,Unary *curr)

{
  Builder *pBVar1;
  Builder *pBVar2;
  Builder *this_00;
  BinaryOp op;
  Index IVar3;
  LocalGet *pLVar4;
  Const *pCVar5;
  Binary *pBVar6;
  Const *right;
  LocalGet *value;
  Unary *pUVar7;
  Binary *pBVar8;
  Unary *ifTrue;
  If *pIVar9;
  LocalSet *any;
  LocalSet *append;
  Block *e;
  UnaryOp op_00;
  BinaryOp op_01;
  UnaryOp op_02;
  Type TStack_1b0;
  undefined1 local_1a8 [8];
  TempVar highBits;
  Literal local_170;
  Literal local_158;
  Literal local_140;
  Literal local_128;
  Literal local_110;
  Unary *local_f8;
  Unary *local_f0;
  undefined1 auStack_e8 [8];
  Literal litZero;
  undefined1 auStack_c8 [8];
  Literal litOne;
  undefined1 auStack_a8 [8];
  Literal u32Max;
  UnaryOp local_74;
  UnaryOp local_70;
  BinaryOp local_6c;
  undefined1 local_68 [8];
  TempVar f;
  BinaryOp local_3c;
  BinaryOp local_38;
  UnaryOp local_34;
  
  litZero.field_0.func.super_IString.str._M_str = (char *)0x0;
  auStack_e8 = (undefined1  [8])0x0;
  litZero.field_0.i64 = 0;
  litOne.field_0.func.super_IString.str._M_str = (char *)0x0;
  auStack_c8 = (undefined1  [8])0x0;
  litOne.field_0.i64 = 0;
  u32Max.field_0.func.super_IString.str._M_str = (char *)0x0;
  auStack_a8 = (undefined1  [8])0x0;
  u32Max.field_0.i64 = 0;
  local_f0 = curr;
  switch(curr->op) {
  case TruncSFloat32ToInt64:
  case TruncUFloat32ToInt64:
    local_68 = (undefined1  [8])((ulong)local_68 & 0xffffffff00000000);
    f.pass = (I64ToI32Lowering *)0x4;
    Literal::operator=((Literal *)auStack_e8,(Literal *)local_68);
    Literal::~Literal((Literal *)local_68);
    local_68._0_4_ = 0x3f800000;
    f.pass = (I64ToI32Lowering *)0x4;
    Literal::operator=((Literal *)auStack_c8,(Literal *)local_68);
    Literal::~Literal((Literal *)local_68);
    local_68._0_4_ = 0x4f800000;
    f.pass = (I64ToI32Lowering *)0x4;
    Literal::operator=((Literal *)auStack_a8,(Literal *)local_68);
    Literal::~Literal((Literal *)local_68);
    local_34 = TruncUFloat32ToInt32;
    local_74 = ConvertUInt32ToFloat32;
    op_02 = AbsFloat32;
    op_00 = FloorFloat32;
    local_70 = CeilFloat32;
    op_01 = GeFloat32;
    local_6c = GtFloat32;
    op = MinFloat32;
    local_3c = DivFloat32;
    local_38 = SubFloat32;
    TStack_1b0.id = 4;
    break;
  default:
    abort();
  case TruncSFloat64ToInt64:
  case TruncUFloat64ToInt64:
    local_68 = (undefined1  [8])0x0;
    f.pass = (I64ToI32Lowering *)0x5;
    Literal::operator=((Literal *)auStack_e8,(Literal *)local_68);
    Literal::~Literal((Literal *)local_68);
    local_68 = (undefined1  [8])0x3ff0000000000000;
    f.pass = (I64ToI32Lowering *)0x5;
    Literal::operator=((Literal *)auStack_c8,(Literal *)local_68);
    Literal::~Literal((Literal *)local_68);
    local_68 = (undefined1  [8])0x41f0000000000000;
    f.pass = (I64ToI32Lowering *)0x5;
    Literal::operator=((Literal *)auStack_a8,(Literal *)local_68);
    Literal::~Literal((Literal *)local_68);
    local_34 = TruncUFloat64ToInt32;
    local_74 = ConvertUInt32ToFloat64;
    op_02 = AbsFloat64;
    op_00 = FloorFloat64;
    local_70 = CeilFloat64;
    op_01 = GeFloat64;
    local_6c = GtFloat64;
    op = MinFloat64;
    local_3c = DivFloat64;
    local_38 = SubFloat64;
    TStack_1b0.id = 5;
  }
  f.ty.id = TStack_1b0.id;
  getTemp((TempVar *)local_68,this,TStack_1b0);
  getTemp((TempVar *)local_1a8,this,(Type)0x2);
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar3 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_68);
  pLVar4 = Builder::makeLocalGet(pBVar1,IVar3,f.ty);
  pBVar2 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  Literal::Literal((Literal *)&highBits.ty,(Literal *)auStack_a8);
  pCVar5 = Builder::makeConst(pBVar2,(Literal *)&highBits.ty);
  pBVar6 = Builder::makeBinary(pBVar1,local_3c,(Expression *)pLVar4,(Expression *)pCVar5);
  local_f8 = Builder::makeUnary(pBVar1,op_00,(Expression *)pBVar6);
  pBVar2 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  Literal::Literal(&local_170,(Literal *)auStack_a8);
  pCVar5 = Builder::makeConst(pBVar2,&local_170);
  this_00 = (this->builder)._M_t.
            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
            super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  Literal::Literal(&local_158,(Literal *)auStack_c8);
  right = Builder::makeConst(this_00,&local_158);
  pBVar6 = Builder::makeBinary(pBVar2,local_38,(Expression *)pCVar5,(Expression *)right);
  pBVar6 = Builder::makeBinary(pBVar1,op,(Expression *)local_f8,(Expression *)pBVar6);
  Literal::~Literal(&local_158);
  Literal::~Literal(&local_170);
  Literal::~Literal((Literal *)&highBits.ty);
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar3 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_68);
  pLVar4 = Builder::makeLocalGet(pBVar1,IVar3,f.ty);
  pBVar2 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar3 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_68);
  value = Builder::makeLocalGet(pBVar2,IVar3,f.ty);
  pUVar7 = Builder::makeUnary(pBVar2,local_34,(Expression *)value);
  pUVar7 = Builder::makeUnary(pBVar2,local_74,(Expression *)pUVar7);
  pBVar8 = Builder::makeBinary(pBVar1,local_38,(Expression *)pLVar4,(Expression *)pUVar7);
  pBVar2 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  Literal::Literal(&local_140,(Literal *)auStack_a8);
  pCVar5 = Builder::makeConst(pBVar2,&local_140);
  pBVar8 = Builder::makeBinary(pBVar1,local_3c,(Expression *)pBVar8,(Expression *)pCVar5);
  pUVar7 = Builder::makeUnary(pBVar1,local_70,(Expression *)pBVar8);
  Literal::~Literal(&local_140);
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar3 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_68);
  pLVar4 = Builder::makeLocalGet(pBVar1,IVar3,f.ty);
  pBVar2 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  Literal::Literal(&local_128,(Literal *)auStack_e8);
  pCVar5 = Builder::makeConst(pBVar2,&local_128);
  pBVar8 = Builder::makeBinary(pBVar1,local_6c,(Expression *)pLVar4,(Expression *)pCVar5);
  ifTrue = Builder::makeUnary((this->builder)._M_t.
                              super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                              .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,local_34,
                              (Expression *)pBVar6);
  pUVar7 = Builder::makeUnary((this->builder)._M_t.
                              super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                              .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,local_34,
                              (Expression *)pUVar7);
  pIVar9 = Builder::makeIf(pBVar1,(Expression *)pBVar8,(Expression *)ifTrue,(Expression *)pUVar7);
  Literal::~Literal(&local_128);
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar3 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_68);
  pLVar4 = Builder::makeLocalGet(pBVar1,IVar3,f.ty);
  pUVar7 = Builder::makeUnary(pBVar1,op_02,(Expression *)pLVar4);
  pBVar2 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  Literal::Literal(&local_110,(Literal *)auStack_c8);
  pCVar5 = Builder::makeConst(pBVar2,&local_110);
  pBVar6 = Builder::makeBinary(pBVar1,op_01,(Expression *)pUVar7,(Expression *)pCVar5);
  pCVar5 = Builder::makeConst<int>
                     ((this->builder)._M_t.
                      super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t
                      .super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                      super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,0);
  pIVar9 = Builder::makeIf(pBVar1,(Expression *)pBVar6,(Expression *)pIVar9,(Expression *)pCVar5);
  Literal::~Literal(&local_110);
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar3 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_68);
  any = Builder::makeLocalSet(pBVar1,IVar3,local_f0->value);
  pBVar2 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar3 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_1a8);
  append = Builder::makeLocalSet(pBVar2,IVar3,(Expression *)pIVar9);
  pBVar2 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar3 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_68);
  pLVar4 = Builder::makeLocalGet(pBVar2,IVar3,f.ty);
  pUVar7 = Builder::makeUnary(pBVar2,local_34,(Expression *)pLVar4);
  e = Builder::blockify<wasm::Unary*>(pBVar1,(Expression *)any,(Expression *)append,pUVar7);
  setOutParam(this,(Expression *)e,(TempVar *)local_1a8);
  Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
              ).
              super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
              .super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>,
             (Expression *)e);
  TempVar::~TempVar((TempVar *)local_1a8);
  TempVar::~TempVar((TempVar *)local_68);
  Literal::~Literal((Literal *)auStack_a8);
  Literal::~Literal((Literal *)auStack_c8);
  Literal::~Literal((Literal *)auStack_e8);
  return;
}

Assistant:

void lowerTruncFloatToInt(Unary* curr) {
    // hiBits = if abs(f) >= 1.0 {
    //    if f > 0.0 {
    //        (unsigned) min(
    //          floor(f / (float) U32_MAX),
    //          (float) U32_MAX - 1,
    //        )
    //    } else {
    //        (unsigned) ceil((f - (float) (unsigned) f) / ((float) U32_MAX))
    //    }
    // } else {
    //    0
    // }
    //
    // loBits = (unsigned) f;

    Literal litZero, litOne, u32Max;
    UnaryOp trunc, convert, abs, floor, ceil;
    Type localType;
    BinaryOp ge, gt, min, div, sub;
    switch (curr->op) {
      case TruncSFloat32ToInt64:
      case TruncUFloat32ToInt64: {
        litZero = Literal((float)0);
        litOne = Literal((float)1);
        u32Max = Literal(((float)UINT_MAX) + 1);
        trunc = TruncUFloat32ToInt32;
        convert = ConvertUInt32ToFloat32;
        localType = Type::f32;
        abs = AbsFloat32;
        ge = GeFloat32;
        gt = GtFloat32;
        min = MinFloat32;
        floor = FloorFloat32;
        ceil = CeilFloat32;
        div = DivFloat32;
        sub = SubFloat32;
        break;
      }
      case TruncSFloat64ToInt64:
      case TruncUFloat64ToInt64: {
        litZero = Literal((double)0);
        litOne = Literal((double)1);
        u32Max = Literal(((double)UINT_MAX) + 1);
        trunc = TruncUFloat64ToInt32;
        convert = ConvertUInt32ToFloat64;
        localType = Type::f64;
        abs = AbsFloat64;
        ge = GeFloat64;
        gt = GtFloat64;
        min = MinFloat64;
        floor = FloorFloat64;
        ceil = CeilFloat64;
        div = DivFloat64;
        sub = SubFloat64;
        break;
      }
      default:
        abort();
    }

    TempVar f = getTemp(localType);
    TempVar highBits = getTemp();

    Expression* gtZeroBranch = builder->makeBinary(
      min,
      builder->makeUnary(
        floor,
        builder->makeBinary(div,
                            builder->makeLocalGet(f, localType),
                            builder->makeConst(u32Max))),
      builder->makeBinary(
        sub, builder->makeConst(u32Max), builder->makeConst(litOne)));
    Expression* ltZeroBranch = builder->makeUnary(
      ceil,
      builder->makeBinary(
        div,
        builder->makeBinary(
          sub,
          builder->makeLocalGet(f, localType),
          builder->makeUnary(
            convert,
            builder->makeUnary(trunc, builder->makeLocalGet(f, localType)))),
        builder->makeConst(u32Max)));

    If* highBitsCalc = builder->makeIf(
      builder->makeBinary(
        gt, builder->makeLocalGet(f, localType), builder->makeConst(litZero)),
      builder->makeUnary(trunc, gtZeroBranch),
      builder->makeUnary(trunc, ltZeroBranch));
    If* highBitsVal = builder->makeIf(
      builder->makeBinary(
        ge,
        builder->makeUnary(abs, builder->makeLocalGet(f, localType)),
        builder->makeConst(litOne)),
      highBitsCalc,
      builder->makeConst(int32_t(0)));
    Block* result = builder->blockify(
      builder->makeLocalSet(f, curr->value),
      builder->makeLocalSet(highBits, highBitsVal),
      builder->makeUnary(trunc, builder->makeLocalGet(f, localType)));
    setOutParam(result, std::move(highBits));
    replaceCurrent(result);
  }